

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pp_elif(CTcTokenizer *this)

{
  int iVar1;
  CTcConstVal val;
  
  val.typ_ = TC_CVT_UNK;
  val._32_1_ = 0;
  iVar1 = expand_macros_curline(this,0,1,0);
  if (iVar1 != 0) {
LAB_0024b666:
    clear_linebuf(this);
    return;
  }
  this->curbuf_ = &this->expbuf_;
  (this->p_).p_ = (this->expbuf_).buf_;
  iVar1 = pp_parse_expr(this,&val,1,1,1);
  if (iVar1 != 0) goto LAB_0024b666;
  iVar1 = this->if_sp_;
  if (iVar1 <= this->str_->init_if_level_) {
    log_error(0x273f);
    goto LAB_0024b666;
  }
  if (iVar1 == 0) {
switchD_0024b63e_caseD_0:
    log_error(0x2724);
  }
  else {
    switch(this->if_stack_[(long)iVar1 + -1].state) {
    case TOKIF_NONE:
    case TOKIF_ELSE_YES:
    case TOKIF_ELSE_NO:
      goto switchD_0024b63e_caseD_0;
    case TOKIF_IF_YES:
      this->if_stack_[(long)iVar1 + -1].state = TOKIF_IF_DONE;
      break;
    case TOKIF_IF_NO:
      iVar1 = CTcConstVal::get_val_bool(&val);
      if ((iVar1 != 0) && ((long)this->if_sp_ != 0)) {
        this->if_stack_[(long)this->if_sp_ + -1].state = TOKIF_IF_YES;
      }
    }
  }
  clear_linebuf(this);
  return;
}

Assistant:

void CTcTokenizer::pp_elif()
{
    CTcConstVal val;

    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, TRUE, FALSE))
    {
        clear_linebuf();
        return;
    }

    /* parse out of the expansion buffer */
    start_new_line(&expbuf_, 0);

    /* parse the preprocessor expression */
    if (pp_parse_expr(&val, TRUE, TRUE, TRUE))
    {
        clear_linebuf();
        return;
    }

    /* 
     *   make sure that the #elif occurs in the same file as the
     *   corresponding #if 
     */
    if (if_sp_ <= str_->get_init_if_level())
    {
        /* log the error */
        log_error(TCERR_PP_ELIF_NOT_IN_SAME_FILE);
        
        /* clear the text and abort */
        clear_linebuf();
        return;
    }

    /* check the current #if state */
    switch(get_if_state())
    {
    case TOKIF_IF_YES:
        /* 
         *   we just took the #if branch, so don't take this or any
         *   subsequent #elif or #else branch, regardless of the value of
         *   the condition - set the state to DONE to indicate that we're
         *   skipping everything through the endif 
         */
        change_if_state(TOKIF_IF_DONE);
        break;
        
    case TOKIF_IF_NO:
        /*
         *   We haven't yet taken a #if or #elif branch, so we can take
         *   this branch if its condition is true.  If this branch's
         *   condition is false, stay with NO so that we will consider
         *   future #elif and #else branches. 
         */
        if (val.get_val_bool())
            change_if_state(TOKIF_IF_YES);
        break;
        
    case TOKIF_IF_DONE:
        /* 
         *   we've already taken a #if or #elif branch, so we must ignore
         *   this and subsequent #elif and #else branches until we get to
         *   our #endif - just stay in state DONE 
         */
        break;

    case TOKIF_NONE:
    case TOKIF_ELSE_YES:
    case TOKIF_ELSE_NO:
        /* 
         *   we're not in a #if branch at all, or we're inside a #else; a
         *   #elif is not legal here 
         */
        log_error(TCERR_PP_ELIF_WITHOUT_IF);
        break;
    }

    /* don't retain the directive in the preprocessed source */
    clear_linebuf();
}